

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

string * __thiscall
despot::BaseTag::RandomMap_abi_cxx11_
          (string *__return_storage_ptr__,BaseTag *this,int height,int width,int obstacles)

{
  undefined1 *puVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_168 [32];
  string local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_68;
  int local_64;
  int p;
  int i;
  int h;
  allocator<char> local_49;
  string local_48 [8];
  string map;
  int obstacles_local;
  int width_local;
  int height_local;
  BaseTag *this_local;
  
  map.field_2._12_4_ = obstacles;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,(long)(height * (width + 1) + -1),'.',&local_49);
  std::allocator<char>::~allocator(&local_49);
  for (p = 1; p < height; p = p + 1) {
    puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
    *puVar1 = 10;
  }
  local_64 = 0;
  while (local_64 < (int)map.field_2._12_4_) {
    std::__cxx11::string::length();
    local_68 = despot::Random::NextInt(0x15b198);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if ((*pcVar2 != '\n') &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar2 != '#')) {
      puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
      *puVar1 = 0x23;
      local_64 = local_64 + 1;
    }
  }
  to_string<int>(&local_108,height);
  std::operator+(&local_e8,"mapSize = ",&local_108);
  std::operator+(&local_c8,&local_e8," ");
  to_string<int>(&local_128,width);
  std::operator+(&local_a8,&local_c8,&local_128);
  std::operator+(&local_88,&local_a8,"\n");
  std::__cxx11::string::string(local_168,local_48);
  to_string<std::__cxx11::string>(&local_148,(despot *)local_168,t);
  std::operator+(__return_storage_ptr__,&local_88,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

string BaseTag::RandomMap(int height, int width, int obstacles) {
	string map(height * (width + 1) - 1, '.');
	for (int h = 1; h < height; h++)
		map[h * (width + 1) - 1] = '\n';

	for (int i = 0; i < obstacles;) {
		int p = Random::RANDOM.NextInt(map.length());
		if (map[p] != '\n' && map[p] != '#') {
			map[p] = '#';
			i++;
		}
	}

	return "mapSize = " + to_string(height) + " " + to_string(width) + "\n" + to_string(map);
}